

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_vector.h
# Opt level: O0

bool __thiscall lzham::vector<unsigned_char>::append(vector<unsigned_char> *this,uchar *p,uint n)

{
  bool bVar1;
  int in_EDX;
  undefined8 in_RDI;
  uint unaff_retaddr;
  undefined4 in_stack_00000008;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  if (in_EDX == 0) {
    bVar1 = true;
  }
  else {
    bVar1 = insert((vector<unsigned_char> *)CONCAT44(n,in_stack_00000008),unaff_retaddr,
                   (uchar *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                   (uint)((ulong)in_RDI >> 0x20));
  }
  return bVar1;
}

Assistant:

bool append(const T* p, uint n)
      {
         if (n)
            return insert(m_size, p, n);
         return true;
      }